

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937sampler.hpp
# Opt level: O3

vec2f __thiscall MT19937Sampler::sampleUnitDisk(MT19937Sampler *this)

{
  vec2f vVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar2;
  float fVar3;
  
  do {
    (**(this->super_Sampler)._vptr_Sampler)(this);
    (**(this->super_Sampler)._vptr_Sampler)(this);
    fVar2 = extraout_XMM0_Da + extraout_XMM0_Da + -1.0;
    fVar3 = extraout_XMM0_Da_00 + extraout_XMM0_Da_00 + -1.0;
  } while (1.0 < fVar2 * fVar2 + fVar3 * fVar3);
  vVar1.y = fVar3;
  vVar1.x = fVar2;
  return vVar1;
}

Assistant:

vec2f sampleUnitDisk() {
		float x,y;
		do {
			x = get1f()*2-1;
			y = get1f()*2-1;
		}
		while (x*x+y*y>1);
		return vec2f(x,y);
	}